

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

uint fl_utf8towc(char *src,uint srclen,wchar_t *dst,uint dstlen)

{
  ulong uVar1;
  wchar_t wVar2;
  undefined8 in_RAX;
  ulong uVar3;
  char *end;
  wchar_t len_1;
  wchar_t len;
  undefined8 local_38;
  
  end = src + srclen;
  local_38 = in_RAX;
  if (dstlen != 0) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (end <= src) {
        dst[uVar3] = L'\0';
        return (uint)uVar3;
      }
      wVar2 = (wchar_t)*src;
      if (*src < '\0') {
        wVar2 = fl_utf8decode(src,end,(wchar_t *)((long)&local_38 + 4));
        src = src + local_38._4_4_;
      }
      else {
        src = src + 1;
      }
      dst[uVar3] = wVar2;
      uVar1 = uVar3 + 1;
    } while ((ulong)dstlen != uVar3 + 1);
    dst[uVar3] = L'\0';
  }
  while (src < end) {
    if (*src < '\0') {
      fl_utf8decode(src,end,(wchar_t *)&local_38);
      src = src + (wchar_t)local_38;
    }
    else {
      src = src + 1;
    }
    dstlen = dstlen + 1;
  }
  return dstlen;
}

Assistant:

unsigned fl_utf8towc(const char* src, unsigned srclen,
		  wchar_t* dst, unsigned dstlen)
{
#if defined(WIN32) || defined(__CYGWIN__)
  return fl_utf8toUtf16(src, srclen, (unsigned short*)dst, dstlen);
#else
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    if (p >= e) {
      dst[count] = 0;
      return count;
    }
    if (!(*p & 0x80)) { /* ascii */
      dst[count] = *p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      dst[count] = (wchar_t)ucs;
    }
    if (++count == dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len; fl_utf8decode(p,e,&len);
      p += len;
    }
    ++count;
  }
  return count;
#endif
}